

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::SDLGraphicsSystem::SDLGraphicsSystem
          (SDLGraphicsSystem *this,
          unique_ptr<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
          *sdl)

{
  unique_ptr<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
  *sdl_local;
  SDLGraphicsSystem *this_local;
  
  interfaces::GraphicsSystem::GraphicsSystem(&this->super_GraphicsSystem);
  (this->super_GraphicsSystem)._vptr_GraphicsSystem = (_func_int **)&PTR__SDLGraphicsSystem_00150870
  ;
  std::
  unique_ptr<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
  ::unique_ptr(&this->sdl,sdl);
  std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>::
  unique_ptr<std::function<void(SDL_Window*)>,void>
            ((unique_ptr<SDL_Window,std::function<void(SDL_Window*)>> *)&this->window);
  std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>::
  unique_ptr<std::function<void(SDL_Renderer*)>,void>
            ((unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>> *)&this->renderer);
  std::
  vector<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
  ::vector(&this->textures);
  this->isSDLInitialized = false;
  this->isWindowCreated = false;
  return;
}

Assistant:

SDLGraphicsSystem::SDLGraphicsSystem(std::unique_ptr<SDL::interfaces::Wrapper> sdl):
    sdl {std::move(sdl)} {
}